

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

uint64_t enet_crc64(ENetBuffer *buffers,int bufferCount)

{
  ulong uVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  uVar1 = 0xffffffffffffffff;
  while (0 < bufferCount) {
    bufferCount = bufferCount + -1;
    pbVar2 = (byte *)buffers->data;
    pbVar3 = pbVar2 + buffers->dataLength;
    for (; pbVar2 < pbVar3; pbVar2 = pbVar2 + 1) {
      uVar1 = uVar1 >> 8 ^ crcTable[(uint)*pbVar2 ^ (uint)uVar1 & 0xff];
    }
    buffers = buffers + 1;
  }
  uVar1 = ~uVar1;
  return uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
}

Assistant:

uint64_t enet_crc64(const ENetBuffer* buffers, int bufferCount) {
	uint64_t crc = 0xFFFFFFFFFFFFFFFF;

	while (bufferCount-- > 0) {
		const uint8_t* data = (const uint8_t*)buffers->data;
		const uint8_t* dataEnd = &data[buffers->dataLength];

		while (data < dataEnd) {
			crc = (crc >> 8) ^ crcTable[(uint8_t)crc ^ *data++];
		}

		++buffers;
	}

	return ENET_HOST_TO_NET_64(~crc);
}